

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::chromeRegisterCommandQueue(CLIntercept *this,cl_command_queue queue)

{
  uint uVar1;
  uint uVar2;
  cl_icd_dispatch *pcVar3;
  CChromeTracer *this_00;
  string *queueName;
  CEnumNameMap *this_01;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  cl_icd_dispatch *pcVar7;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  cl_device_id in_stack_00000088;
  CLIntercept *in_stack_00000090;
  cl_uint queueIndex;
  cl_uint queueFamily;
  cl_int testError;
  string deviceIndexString;
  SDeviceInfo *deviceInfo;
  string trackName;
  uint queueNumber;
  cl_command_queue_properties properties;
  cl_device_type deviceType;
  cl_device_id device;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffe48;
  lock_guard<std::mutex> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe70;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  key_type *in_stack_fffffffffffffe88;
  char *__s;
  map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
  *in_stack_fffffffffffffe90;
  cl_command_queue p_Var9;
  string local_100 [36];
  uint local_dc;
  uint local_d8;
  uint local_d4;
  string local_d0 [32];
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  cl_device_id in_stack_ffffffffffffff68;
  CLIntercept *in_stack_ffffffffffffff70;
  string local_68 [32];
  mapped_type local_48;
  ulong local_38 [2];
  cl_device_id local_28;
  uint local_1c;
  cl_command_queue local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_1c = 0;
  local_28 = (cl_device_id)0x0;
  local_38[1] = 0;
  local_38[0] = 0;
  pcVar3 = dispatch(in_RDI);
  uVar1 = (*pcVar3->clGetCommandQueueInfo)(local_10,0x1091,8,&local_28,(size_t *)0x0);
  local_1c = local_1c | uVar1;
  pcVar3 = dispatch(in_RDI);
  uVar1 = (*pcVar3->clGetDeviceInfo)(local_28,0x1000,8,local_38 + 1,(size_t *)0x0);
  local_1c = local_1c | uVar1;
  this_00 = (CChromeTracer *)dispatch(in_RDI);
  uVar1 = (**(cl_api_clGetCommandQueueInfo *)&this_00->field_0x60)
                    (local_10,0x1093,8,local_38,(size_t *)0x0);
  local_1c = uVar1 | local_1c;
  if (local_1c == 0) {
    queueName = (string *)
                std::
                map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
                ::operator[]((map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
                              *)in_stack_fffffffffffffe90,(key_type *)in_stack_fffffffffffffe88);
    local_48 = *(mapped_type *)queueName;
    std::__cxx11::string::string(local_68);
    if ((local_38[0] & 1) == 0) {
      std::__cxx11::string::operator+=(local_68,"IOQ");
    }
    else {
      std::__cxx11::string::operator+=(local_68,"OOQ");
    }
    cacheDeviceInfo(in_stack_00000090,in_stack_00000088);
    this_01 = (CEnumNameMap *)
              std::
              map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
              ::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    psVar8 = (string *)&stack0xffffffffffffff70;
    std::__cxx11::string::string(psVar8);
    getDeviceIndexString
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    __s = in_RDI->m_StringBuffer;
    p_Var9 = local_10;
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    enumName(in_RDI);
    CEnumNameMap::name_device_type_abi_cxx11_(this_01,(cl_device_type)psVar8);
    uVar6 = std::__cxx11::string::c_str();
    snprintf(__s,0x4000," %p.%s %s (%s)",p_Var9,uVar4,uVar5,uVar6);
    std::__cxx11::string::~string(local_b0);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    psVar8 = local_d0;
    std::__cxx11::string::operator=(local_68,psVar8);
    std::__cxx11::string::~string(psVar8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    local_d4 = 0;
    local_d8 = 0;
    local_dc = 0;
    pcVar3 = dispatch(in_RDI);
    uVar2 = (*pcVar3->clGetCommandQueueInfo)(local_10,0x418c,4,&local_d8,(size_t *)0x0);
    local_d4 = local_d4 | uVar2;
    pcVar7 = dispatch(in_RDI);
    uVar2 = (*pcVar7->clGetCommandQueueInfo)(local_10,0x418d,4,&local_dc,(size_t *)0x0);
    local_d4 = uVar2 | local_d4;
    if (local_d4 == 0) {
      snprintf(in_RDI->m_StringBuffer,0x4000," (F:%u I:%u)",(ulong)local_d8,(ulong)local_dc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar3,
                     (char *)psVar8);
      std::__cxx11::string::operator=(local_68,local_100);
      std::__cxx11::string::~string(local_100);
    }
    CChromeTracer::addQueueMetadata(this_00,uVar1,queueName);
    std::__cxx11::string::~string(local_68);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21f75b);
  return;
}

Assistant:

void CLIntercept::chromeRegisterCommandQueue(
    cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_device_id                device = NULL;
    cl_device_type              deviceType = 0;
    cl_command_queue_properties properties = 0;

    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL);
    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof(deviceType),
        &deviceType,
        NULL );
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(properties),
        &properties,
        NULL );

    if( errorCode == CL_SUCCESS )
    {
        unsigned int    queueNumber = m_QueueNumberMap[ queue ];

        std::string trackName;

        if( properties & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            trackName += "OOQ";
        }
        else
        {
            trackName += "IOQ";
        }

        cacheDeviceInfo( device );

        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        {
            std::string deviceIndexString;
            getDeviceIndexString(
                device,
                deviceIndexString );
            CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " %p.%s %s (%s)",
                queue,
                deviceIndexString.c_str(),
                deviceInfo.Name.c_str(),
                enumName().name_device_type( deviceInfo.Type ).c_str() );
            trackName = trackName + m_StringBuffer;
        }

        {
            cl_int  testError = CL_SUCCESS;

            cl_uint queueFamily = 0;
            cl_uint queueIndex = 0;

            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_FAMILY_INTEL,
                sizeof(queueFamily),
                &queueFamily,
                NULL );
            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_INDEX_INTEL,
                sizeof(queueIndex),
                &queueIndex,
                NULL );
            if( testError == CL_SUCCESS )
            {
                CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " (F:%u I:%u)",
                    queueFamily,
                    queueIndex );
                trackName = trackName + m_StringBuffer;
            }
        }

        m_ChromeTrace.addQueueMetadata( queueNumber, trackName );
    }
}